

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::OneofOptions::InternalSwap(OneofOptions *this,OneofOptions *other)

{
  void *pvVar1;
  UnknownFieldSet *other_00;
  
  internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  pvVar1 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    if (((ulong)pvVar1 & 1) == 0) goto LAB_002a2bfa;
LAB_002a2be9:
    other_00 = (UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8);
  }
  else {
    if (((ulong)pvVar1 & 1) != 0) goto LAB_002a2be9;
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
  }
  internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,other_00);
LAB_002a2bfa:
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(other->uninterpreted_option_).super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void OneofOptions::InternalSwap(OneofOptions* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  uninterpreted_option_.InternalSwap(&other->uninterpreted_option_);
}